

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
::fulfill(AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
          *this,Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> local_1e0;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
    ExceptionOr(&local_1e0,value);
    ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
    operator=(&this->result,&local_1e0);
    uVar2 = local_1e0.value.ptr.field_1._16_8_;
    uVar1 = local_1e0.value.ptr.field_1._8_8_;
    if (((local_1e0.value.ptr.isSet == true) &&
        (local_1e0.value.ptr.field_1.value.ptr.isSet == true)) &&
       (local_1e0.value.ptr.field_1._8_8_ != 0)) {
      local_1e0.value.ptr.field_1._8_8_ = 0;
      local_1e0.value.ptr.field_1._16_8_ = 0;
      (*(code *)**(undefined8 **)local_1e0.value.ptr.field_1._24_8_)
                (local_1e0.value.ptr.field_1._24_8_,uVar1,1,uVar2,uVar2,0);
    }
    if (local_1e0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1e0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }